

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::create_dir(filename_t *path)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  filename_t *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  size_type token_pos;
  size_t search_offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  undefined8 local_18;
  undefined1 local_1;
  
  bVar1 = path_exists(in_stack_00000020);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5f663d);
    if (bVar1) {
      local_1 = 0;
    }
    else {
      local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      do {
        local_20 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        if (local_20 == 0xffffffffffffffff) {
          local_20 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI)
          ;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_ffffffffffffffb8,
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x5f66aa);
        if (((bVar1) || (bVar1 = path_exists(in_stack_00000020), bVar1)) ||
           (in_stack_ffffffffffffffaf = mkdir_((filename_t *)0x5f66c6),
           (bool)in_stack_ffffffffffffffaf)) {
          local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_20 + 1);
          in_stack_ffffffffffffffb0 = 0;
        }
        else {
          local_1 = 0;
          in_stack_ffffffffffffffb0 = 1;
        }
        std::__cxx11::string::~string(in_stack_ffffffffffffffa0);
        if (in_stack_ffffffffffffffb0 != 0) goto LAB_005f6757;
        in_stack_ffffffffffffffa0 = local_18;
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI);
      } while (in_stack_ffffffffffffffa0 < pbVar2);
      local_1 = 1;
    }
  }
LAB_005f6757:
  return (bool)(local_1 & 1);
}

Assistant:

SPDLOG_INLINE bool create_dir(const filename_t &path) {
    if (path_exists(path)) {
        return true;
    }

    if (path.empty()) {
        return false;
    }

    size_t search_offset = 0;
    do {
        auto token_pos = path.find_first_of(folder_seps_filename, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos) {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);
#ifdef _WIN32
        // if subdir is just a drive letter, add a slash e.g. "c:"=>"c:\",
        // otherwise path_exists(subdir) returns false (issue #3079)
        const bool is_drive = subdir.length() == 2 && subdir[1] == ':';
        if (is_drive) {
            subdir += '\\';
            token_pos++;
        }
#endif

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir)) {
            return false;  // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}